

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

char * skip_int(char *start,int *out_n)

{
  char cVar1;
  int iVar2;
  char *__nptr;
  ushort **ppuVar3;
  char *pcStack_28;
  char c;
  char *s;
  int *out_n_local;
  char *start_local;
  
  *out_n = 0;
  __nptr = skip_white(start);
  pcStack_28 = __nptr;
  if (__nptr == (char *)0x0) {
    start_local = (char *)0x0;
  }
  else {
    while ((*pcStack_28 != '\0' &&
           (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*pcStack_28] & 0x800) != 0))) {
      pcStack_28 = pcStack_28 + 1;
    }
    cVar1 = *pcStack_28;
    *pcStack_28 = '\0';
    iVar2 = atoi(__nptr);
    *out_n = iVar2;
    *pcStack_28 = cVar1;
    start_local = pcStack_28;
  }
  return start_local;
}

Assistant:

static char *skip_int(char *start, int *out_n)
{
    char *s;
    char c;

    *out_n = 0;

    s = skip_white(start);
    if (s == NULL) {
        return NULL;
    }
    start = s;

    while (*s) {
        if (!isdigit(*s)) {
            break;
        }
        ++s;
    }
    c = *s;
    *s = 0;
    *out_n = atoi(start);
    *s = c;
    return s;
}